

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filters.cpp
# Opt level: O0

void __thiscall
pbrt::FilterSampler::FilterSampler(FilterSampler *this,Filter *filter,Allocator alloc)

{
  Vector2<float> v;
  Vector2<float> v_00;
  Point2f p_00;
  Point2f t;
  undefined1 auVar1 [16];
  allocator_type allocator;
  Allocator alloc_00;
  Allocator alloc_01;
  Bounds2f domain;
  int iVar2;
  Tuple2<pbrt::Point2,_float> in_RSI;
  long in_RDI;
  Point2<float> PVar3;
  Array2D<float> *extraout_XMM0_Qb;
  undefined1 auVar4 [64];
  undefined1 auVar5 [64];
  undefined1 auVar6 [64];
  undefined1 auVar7 [64];
  undefined1 auVar8 [64];
  Point2f p;
  int x;
  int y;
  PiecewiseConstant2D *in_stack_fffffffffffffe48;
  float in_stack_fffffffffffffe50;
  Float in_stack_fffffffffffffe54;
  float in_stack_fffffffffffffe58;
  float in_stack_fffffffffffffe5c;
  Array2D<float> *this_00;
  int in_stack_fffffffffffffe70;
  int in_stack_fffffffffffffe74;
  Tuple2<pbrt::Point2,_float> in_stack_fffffffffffffe78;
  float in_stack_fffffffffffffe80;
  float in_stack_fffffffffffffe84;
  int in_stack_fffffffffffffe88;
  int in_stack_fffffffffffffe8c;
  int iVar9;
  Tuple2<pbrt::Point2,_float> TVar10;
  int local_74;
  int local_70;
  undefined1 extraout_var [56];
  undefined1 extraout_var_00 [56];
  undefined1 extraout_var_01 [56];
  undefined1 extraout_var_02 [56];
  undefined1 extraout_var_03 [56];
  
  TVar10 = in_RSI;
  auVar4._0_8_ = Filter::Radius((Filter *)in_stack_fffffffffffffe48);
  auVar4._8_56_ = extraout_var;
  vmovlpd_avx(auVar4._0_16_);
  auVar5._0_8_ = Tuple2<pbrt::Vector2,_float>::operator-
                           ((Tuple2<pbrt::Vector2,_float> *)in_stack_fffffffffffffe48);
  auVar5._8_56_ = extraout_var_00;
  vmovlpd_avx(auVar5._0_16_);
  v.super_Tuple2<pbrt::Vector2,_float>.y = in_stack_fffffffffffffe54;
  v.super_Tuple2<pbrt::Vector2,_float>.x = in_stack_fffffffffffffe50;
  Point2<float>::Point2<float>((Point2<float> *)in_stack_fffffffffffffe48,v);
  auVar6._0_8_ = Filter::Radius((Filter *)in_stack_fffffffffffffe48);
  auVar6._8_56_ = extraout_var_01;
  vmovlpd_avx(auVar6._0_16_);
  v_00.super_Tuple2<pbrt::Vector2,_float>.y = in_stack_fffffffffffffe54;
  v_00.super_Tuple2<pbrt::Vector2,_float>.x = in_stack_fffffffffffffe50;
  Point2<float>::Point2<float>((Point2<float> *)in_stack_fffffffffffffe48,v_00);
  PVar3.super_Tuple2<pbrt::Point2,_float>.y = in_stack_fffffffffffffe84;
  PVar3.super_Tuple2<pbrt::Point2,_float>.x = in_stack_fffffffffffffe80;
  Bounds2<float>::Bounds2
            ((Bounds2<float> *)CONCAT44(in_stack_fffffffffffffe74,in_stack_fffffffffffffe70),PVar3,
             (Point2<float>)in_stack_fffffffffffffe78);
  auVar7._0_8_ = Filter::Radius((Filter *)in_stack_fffffffffffffe48);
  auVar7._8_56_ = extraout_var_02;
  vmovlpd_avx(auVar7._0_16_);
  auVar8._0_8_ = Filter::Radius((Filter *)in_stack_fffffffffffffe48);
  auVar8._8_56_ = extraout_var_03;
  vmovlpd_avx(auVar8._0_16_);
  allocator.memoryResource._4_4_ = in_stack_fffffffffffffe84;
  allocator.memoryResource._0_4_ = in_stack_fffffffffffffe80;
  Array2D<float>::Array2D
            ((Array2D<float> *)in_stack_fffffffffffffe78,in_stack_fffffffffffffe74,
             in_stack_fffffffffffffe70,allocator);
  alloc_00.memoryResource._4_4_ = in_stack_fffffffffffffe84;
  alloc_00.memoryResource._0_4_ = in_stack_fffffffffffffe80;
  PiecewiseConstant2D::PiecewiseConstant2D
            ((PiecewiseConstant2D *)in_stack_fffffffffffffe78,alloc_00);
  local_70 = 0;
  while( true ) {
    iVar9 = local_70;
    iVar2 = Array2D<float>::YSize((Array2D<float> *)(in_RDI + 0x10));
    if (iVar2 <= iVar9) break;
    local_74 = 0;
    while( true ) {
      in_stack_fffffffffffffe88 = local_74;
      in_stack_fffffffffffffe8c = Array2D<float>::XSize((Array2D<float> *)(in_RDI + 0x10));
      if (in_stack_fffffffffffffe8c <= in_stack_fffffffffffffe88) break;
      in_stack_fffffffffffffe80 = (float)local_74 + 0.5;
      in_stack_fffffffffffffe84 = (float)Array2D<float>::XSize((Array2D<float> *)(in_RDI + 0x10));
      Array2D<float>::YSize((Array2D<float> *)(in_RDI + 0x10));
      Point2<float>::Point2
                ((Point2<float> *)CONCAT44(in_stack_fffffffffffffe54,in_stack_fffffffffffffe50),
                 (float)((ulong)in_stack_fffffffffffffe48 >> 0x20),
                 SUB84(in_stack_fffffffffffffe48,0));
      t.super_Tuple2<pbrt::Point2,_float>.y = in_stack_fffffffffffffe5c;
      t.super_Tuple2<pbrt::Point2,_float>.x = in_stack_fffffffffffffe58;
      PVar3 = Bounds2<float>::Lerp
                        ((Bounds2<float> *)
                         CONCAT44(in_stack_fffffffffffffe54,in_stack_fffffffffffffe50),t);
      in_stack_fffffffffffffe58 = PVar3.super_Tuple2<pbrt::Point2,_float>.x;
      in_stack_fffffffffffffe5c = PVar3.super_Tuple2<pbrt::Point2,_float>.y;
      auVar1._8_8_ = extraout_XMM0_Qb;
      auVar1._0_4_ = PVar3.super_Tuple2<pbrt::Point2,_float>.x;
      auVar1._4_4_ = PVar3.super_Tuple2<pbrt::Point2,_float>.y;
      vmovlpd_avx(auVar1);
      p_00.super_Tuple2<pbrt::Point2,_float>.y = in_stack_fffffffffffffe54;
      p_00.super_Tuple2<pbrt::Point2,_float>.x = in_stack_fffffffffffffe50;
      this_00 = extraout_XMM0_Qb;
      in_stack_fffffffffffffe54 = Filter::Evaluate((Filter *)in_stack_fffffffffffffe48,p_00);
      in_stack_fffffffffffffe48 =
           (PiecewiseConstant2D *)
           Array2D<float>::operator()
                     (this_00,(int)in_stack_fffffffffffffe5c,(int)in_stack_fffffffffffffe58);
      (in_stack_fffffffffffffe48->domain).pMin.super_Tuple2<pbrt::Point2,_float>.x =
           in_stack_fffffffffffffe54;
      local_74 = local_74 + 1;
    }
    local_70 = local_70 + 1;
  }
  domain.pMax.super_Tuple2<pbrt::Point2,_float> = TVar10;
  domain.pMin.super_Tuple2<pbrt::Point2,_float> = in_RSI;
  alloc_01.memoryResource._4_4_ = iVar2;
  alloc_01.memoryResource._0_4_ = iVar9;
  PiecewiseConstant2D::PiecewiseConstant2D
            ((PiecewiseConstant2D *)CONCAT44(in_stack_fffffffffffffe8c,in_stack_fffffffffffffe88),
             (Array2D<float> *)CONCAT44(in_stack_fffffffffffffe84,in_stack_fffffffffffffe80),domain,
             alloc_01);
  PiecewiseConstant2D::operator=
            ((PiecewiseConstant2D *)CONCAT44(in_stack_fffffffffffffe54,in_stack_fffffffffffffe50),
             in_stack_fffffffffffffe48);
  PiecewiseConstant2D::~PiecewiseConstant2D
            ((PiecewiseConstant2D *)CONCAT44(in_stack_fffffffffffffe54,in_stack_fffffffffffffe50));
  return;
}

Assistant:

FilterSampler::FilterSampler(Filter filter, Allocator alloc)
    : domain(Point2f(-filter.Radius()), Point2f(filter.Radius())),
      f(int(32 * filter.Radius().x), int(32 * filter.Radius().y), alloc),
      distrib(alloc) {
    // Tabularize unnormalized filter function in _f_
    for (int y = 0; y < f.YSize(); ++y)
        for (int x = 0; x < f.XSize(); ++x) {
            Point2f p =
                domain.Lerp(Point2f((x + 0.5f) / f.XSize(), (y + 0.5f) / f.YSize()));
            f(x, y) = filter.Evaluate(p);
        }

    // Compute sampling distribution for filter
    distrib = PiecewiseConstant2D(f, domain, alloc);
}